

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O2

void glu::getProgramInterfaceBlockInfo
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,
               InterfaceBlockInfo *info)

{
  GLint *pGVar1;
  deUint32 dVar2;
  GLenum err;
  GLenum local_34;
  
  info->index = index;
  dVar2 = getProgramResourceUint(gl,program,programInterface,index,0x9302);
  info->bufferBinding = dVar2;
  dVar2 = getProgramResourceUint(gl,program,programInterface,index,0x9303);
  info->dataSize = dVar2;
  dVar2 = getProgramResourceUint(gl,program,programInterface,index,0x9304);
  std::vector<int,_std::allocator<int>_>::resize(&info->activeVariables,(long)(int)dVar2);
  if (0 < (int)dVar2) {
    local_34 = 0x9305;
    pGVar1 = (info->activeVariables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*gl->getProgramResourceiv)
              (program,programInterface,index,1,&local_34,
               (GLsizei)((ulong)((long)(info->activeVariables).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pGVar1) >> 2),
               (GLsizei *)0x0,pGVar1);
    err = (*gl->getError)();
    checkError(err,"glGetProgramResourceiv(GL_PROGRAM_ACTIVE_VARIABLES)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluProgramInterfaceQuery.cpp"
               ,0x46);
  }
  if (programInterface != 0x92c0) {
    getProgramResourceName(gl,program,programInterface,index,&info->name);
  }
  return;
}

Assistant:

void getProgramInterfaceBlockInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, InterfaceBlockInfo& info)
{
	info.index			= index;
	info.bufferBinding	= getProgramResourceUint(gl, program, programInterface, index, GL_BUFFER_BINDING);
	info.dataSize		= getProgramResourceUint(gl, program, programInterface, index, GL_BUFFER_DATA_SIZE);

	getProgramInterfaceActiveVariables(gl, program, programInterface, index, info.activeVariables);

	if (programInterface != GL_ATOMIC_COUNTER_BUFFER)
		getProgramResourceName(gl, program, programInterface, index, info.name);
}